

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ssl_connect_state sVar1;
  Curl_easy *pCVar2;
  Curl_easy *pCVar3;
  Curl_easy *data;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var4;
  _Bool _Var5;
  undefined1 uVar6;
  int iVar7;
  CURLcode CVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint *puVar14;
  ulong uVar15;
  SSL_CIPHER *c;
  char *pcVar16;
  SSL_SESSION *pSVar17;
  SSL_METHOD *meth;
  SSL_CTX *pSVar18;
  BIO_METHOD *pBVar19;
  stack_st_X509 *psVar20;
  BIO *pBVar21;
  X509 *pXVar22;
  X509_NAME *pXVar23;
  size_t sVar24;
  undefined8 uVar25;
  ASN1_INTEGER *pAVar26;
  ASN1_STRING *pAVar27;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar28;
  EVP_PKEY *pEVar29;
  X509 *pXVar30;
  GENERAL_NAMES *a_00;
  int *piVar31;
  EVP_PKEY *__s;
  BIO *pBVar32;
  undefined8 extraout_RAX;
  PKCS12 *p12;
  X509_NAME_ENTRY *ne;
  size_t uznum;
  FILE *pFVar33;
  X509_PUBKEY *pXVar34;
  uchar *puVar35;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar36;
  OCSP_SINGLERESP *single;
  evp_pkey_st *from;
  UI_METHOD *method;
  UI_METHOD *pUVar37;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *pSVar38;
  undefined7 uVar39;
  curl_socket_t writefd;
  long lVar40;
  size_t size;
  size_t size_00;
  byte bVar41;
  CURLcode CVar42;
  uchar uVar43;
  curl_socket_t readfd0;
  BIGNUM *pBVar44;
  connectdata *unaff_R12;
  connectdata *pcVar45;
  char *pcVar46;
  ulong uVar47;
  ulong uVar48;
  ssl_connect_data *psVar49;
  bool bVar50;
  char *ptr;
  BUF_MEM *biomem;
  X509_ALGOR *palg;
  BIGNUM *q;
  ASN1_BIT_STRING *psig;
  BIGNUM *iqmp;
  BIGNUM *dmq1;
  BIGNUM *dmp1;
  EVP_PKEY *pri;
  in6_addr addr;
  ASN1_GENERALIZEDTIME *local_360;
  BIO *local_358;
  ASN1_GENERALIZEDTIME *local_350;
  X509 *local_348;
  BIO *local_340;
  X509_ALGOR *local_338;
  EVP_PKEY *local_330;
  EVP_PKEY *local_328;
  Curl_easy *local_320;
  BIO *local_318;
  BIGNUM *local_310;
  int *local_308;
  undefined8 local_300;
  X509 *local_2f8;
  ssl_connect_data *local_2f0;
  long local_2e8;
  _Bool *local_2e0;
  char *local_2d8;
  BIGNUM *local_2d0;
  BIGNUM *local_2c8;
  BIGNUM *local_2c0;
  SSL_SESSION *local_2b8 [16];
  X509 *local_238;
  undefined1 uStack_230;
  undefined7 uStack_22f;
  char local_228 [496];
  undefined1 local_38 [8];
  
  lVar40 = (long)sockindex;
  if (conn->ssl[lVar40].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar2 = conn->data;
  psVar49 = conn->ssl + lVar40;
  local_348 = (X509 *)CONCAT44(local_348._4_4_,conn->sock[lVar40]);
  local_2e8 = lVar40;
  local_2e0 = done;
  if (conn->ssl[lVar40].connecting_state == ssl_connect_1) {
    lVar13 = Curl_timeleft(pCVar2,(timeval *)0x0,true);
    if (lVar13 < 0) {
LAB_001486be:
      Curl_failf(pCVar2,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pCVar3 = conn->data;
    uVar11 = conn->sock[local_2e8];
    unaff_R12 = (connectdata *)(ulong)uVar11;
    Curl_ossl_seed(pCVar3);
    (pCVar3->set).ssl.certverifyresult = 1;
    lVar13 = (pCVar3->set).ssl.version;
    if (lVar13 == 2) {
      pcVar46 = "OpenSSL was built without SSLv2 support";
LAB_00148763:
      Curl_failf(pCVar3,pcVar46);
      CVar8 = CURLE_NOT_BUILT_IN;
    }
    else {
      if (lVar13 == 3) {
        pcVar46 = "OpenSSL was built without SSLv3 support";
        goto LAB_00148763;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar18 = (SSL_CTX *)conn->ssl[lVar40].ctx;
      if (pSVar18 != (SSL_CTX *)0x0) {
        SSL_CTX_free(pSVar18);
      }
      pSVar18 = SSL_CTX_new(meth);
      conn->ssl[lVar40].ctx = (SSL_CTX *)pSVar18;
      if (pSVar18 == (SSL_CTX *)0x0) {
        uVar15 = ERR_peek_error();
        pcVar46 = ERR_error_string(uVar15,(char *)0x0);
        Curl_failf(pCVar3,"SSL: couldn\'t create a context: %s",pcVar46);
LAB_001489ff:
        CVar8 = CURLE_OUT_OF_MEMORY;
        goto LAB_00148773;
      }
      SSL_CTX_ctrl(pSVar18,0x21,0x10,(void *)0x0);
      if (((pCVar3->set).fdebug != (curl_debug_callback)0x0) && ((pCVar3->set).verbose == true)) {
        SSL_CTX_set_msg_callback((SSL_CTX *)conn->ssl[lVar40].ctx,ssl_tls_trace);
        SSL_CTX_ctrl((SSL_CTX *)conn->ssl[lVar40].ctx,0x10,0,conn);
      }
      uVar15 = 0x80024850;
      if ((conn->data->set).ssl_enable_beast == false) {
        uVar15 = 0x80024050;
      }
      uVar47 = (pCVar3->set).ssl.version;
      if ((uVar47 < 7) && ((0x7bU >> ((uint)uVar47 & 0x1f) & 1) != 0)) {
        SSL_CTX_set_options(conn->ssl[lVar40].ctx,uVar15 | *(ulong *)(&DAT_00154ca8 + uVar47 * 8));
        if ((conn->bits).tls_enable_npn == true) {
          SSL_CTX_set_next_proto_select_cb
                    ((SSL_CTX *)conn->ssl[lVar40].ctx,select_next_proto_cb,conn);
        }
        if ((conn->bits).tls_enable_alpn == true) {
          local_238._0_1_ = '\b';
          local_238._1_7_ = 0x2e312f70747468;
          uStack_230 = 0x31;
          Curl_infof(pCVar3,"ALPN, offering %s\n","http/1.1");
          SSL_CTX_set_alpn_protos(conn->ssl[lVar40].ctx,&local_238,9);
        }
        pBVar21 = (BIO *)(pCVar3->set).str[0];
        if ((pBVar21 == (BIO *)0x0) && ((pCVar3->set).str[1] == (char *)0x0)) {
LAB_0014a722:
          pcVar46 = (pCVar3->set).str[0x17];
          pcVar16 = "ALL:!EXPORT:!EXPORT40:!EXPORT56:!aNULL:!LOW:!RC4:@STRENGTH";
          if (pcVar46 != (char *)0x0) {
            pcVar16 = pcVar46;
          }
          iVar7 = SSL_CTX_set_cipher_list((SSL_CTX *)conn->ssl[lVar40].ctx,pcVar16);
          if (iVar7 == 0) {
            Curl_failf(pCVar3,"failed setting cipher list: %s",pcVar16);
            CVar8 = CURLE_SSL_CIPHER;
          }
          else {
            Curl_infof(pCVar3,"Cipher selection: %s\n",pcVar16);
            pcVar46 = (pCVar3->set).str[0x15];
            if ((pcVar46 != (char *)0x0) || ((pCVar3->set).str[0x14] != (char *)0x0)) {
              iVar7 = SSL_CTX_load_verify_locations
                                ((SSL_CTX *)conn->ssl[lVar40].ctx,pcVar46,(pCVar3->set).str[0x14]);
              if (iVar7 == 0) {
                if ((pCVar3->set).ssl.verifypeer == true) {
                  pcVar46 = (pCVar3->set).str[0x15];
                  if (pcVar46 == (char *)0x0) {
                    pcVar46 = "none";
                  }
                  pcVar16 = (pCVar3->set).str[0x14];
                  if (pcVar16 == (char *)0x0) {
                    pcVar16 = "none";
                  }
                  Curl_failf(pCVar3,
                             "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s"
                             ,pcVar46,pcVar16);
                  CVar8 = CURLE_SSL_CACERT_BADFILE;
                  goto LAB_00148773;
                }
                pcVar46 = "error setting certificate verify locations, continuing anyway:\n";
              }
              else {
                pcVar46 = "successfully set certificate verify locations:\n";
              }
              Curl_infof(pCVar3,pcVar46);
              pcVar46 = (pCVar3->set).str[0x15];
              if (pcVar46 == (char *)0x0) {
                pcVar46 = "none";
              }
              Curl_infof(pCVar3,"  CAfile: %s\n  CApath: %s\n",pcVar46);
            }
            if ((pCVar3->set).str[0x1b] != (char *)0x0) {
              pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar40].ctx);
              m = X509_LOOKUP_file();
              ctx = X509_STORE_add_lookup(pXVar36,m);
              if ((ctx == (X509_LOOKUP *)0x0) ||
                 (iVar7 = X509_load_crl_file(ctx,(pCVar3->set).str[0x1b],1), iVar7 == 0)) {
                Curl_failf(pCVar3,"error loading CRL file: %s",(pCVar3->set).str[0x1b]);
                CVar8 = CURLE_SSL_CRL_BADFILE;
                goto LAB_00148773;
              }
              Curl_infof(pCVar3,"successfully load CRL file:\n");
              pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar40].ctx);
              X509_STORE_set_flags(pXVar36,0xc);
              pcVar46 = (pCVar3->set).str[0x1b];
              pcVar16 = "none";
              if (pcVar46 != (char *)0x0) {
                pcVar16 = pcVar46;
              }
              Curl_infof(pCVar3,"  CRLfile: %s\n",pcVar16);
            }
            SSL_CTX_set_verify((SSL_CTX *)conn->ssl[lVar40].ctx,(uint)(pCVar3->set).ssl.verifypeer,
                               (callback *)0x0);
            p_Var4 = (pCVar3->set).ssl.fsslctx;
            if ((p_Var4 == (curl_ssl_ctx_callback)0x0) ||
               (CVar8 = (*p_Var4)(pCVar3,conn->ssl[lVar40].ctx,(pCVar3->set).ssl.fsslctxp),
               CVar8 == CURLE_OK)) {
              pSVar38 = (SSL *)conn->ssl[lVar40].handle;
              if (pSVar38 != (SSL *)0x0) {
                SSL_free(pSVar38);
              }
              pSVar38 = SSL_new((SSL_CTX *)conn->ssl[lVar40].ctx);
              conn->ssl[lVar40].handle = (SSL *)pSVar38;
              if (pSVar38 == (SSL *)0x0) {
                Curl_failf(pCVar3,"SSL: couldn\'t create a context (handle)!");
                goto LAB_001489ff;
              }
              if ((pCVar3->set).ssl.verifystatus == true) {
                SSL_ctrl(pSVar38,0x41,1,(void *)0x0);
              }
              SSL_set_connect_state((SSL *)conn->ssl[lVar40].handle);
              conn->ssl[lVar40].server_cert = (X509 *)0x0;
              iVar7 = inet_pton(2,(conn->host).name,&local_238);
              if (((iVar7 == 0) && (iVar7 = inet_pton(10,(conn->host).name,&local_238), iVar7 == 0))
                 && (lVar13 = SSL_ctrl((SSL *)conn->ssl[lVar40].handle,0x37,0,(conn->host).name),
                    lVar13 == 0)) {
                Curl_infof(pCVar3,
                           "WARNING: failed to configure server name indication (SNI) TLS extension\n"
                          );
              }
              if ((conn->ssl_config).sessionid == true) {
                local_2b8[0] = (SSL_SESSION *)0x0;
                Curl_ssl_sessionid_lock(conn);
                _Var5 = Curl_ssl_getsessionid(conn,local_2b8,(size_t *)0x0);
                if (_Var5) {
LAB_0014aa68:
                  Curl_ssl_sessionid_unlock(conn);
                  goto LAB_0014aa75;
                }
                iVar7 = SSL_set_session((SSL *)conn->ssl[lVar40].handle,local_2b8[0]);
                if (iVar7 != 0) {
                  Curl_infof(pCVar3,"SSL re-using session ID\n");
                  goto LAB_0014aa68;
                }
                Curl_ssl_sessionid_unlock(conn);
                uVar15 = ERR_get_error();
                pcVar46 = ERR_error_string(uVar15,(char *)0x0);
                pcVar16 = "SSL: SSL_set_session failed: %s";
                unaff_R12 = conn;
              }
              else {
LAB_0014aa75:
                iVar7 = SSL_set_fd((SSL *)conn->ssl[lVar40].handle,(int)unaff_R12);
                if (iVar7 != 0) {
                  conn->ssl[lVar40].connecting_state = ssl_connect_2;
                  CVar8 = CURLE_OK;
                  goto LAB_00148773;
                }
                uVar15 = ERR_get_error();
                pcVar46 = ERR_error_string(uVar15,(char *)0x0);
                pcVar16 = "SSL: SSL_set_fd failed: %s";
              }
              Curl_failf(pCVar3,pcVar16,pcVar46);
              goto LAB_001489d1;
            }
            Curl_failf(pCVar3,"error signaled by ssl ctx callback");
          }
        }
        else {
          pSVar18 = (SSL_CTX *)conn->ssl[lVar40].ctx;
          local_330 = (EVP_PKEY *)(pCVar3->set).str[1];
          local_340 = (BIO *)(pCVar3->set).str[0xb];
          local_328 = (EVP_PKEY *)(pCVar3->set).str[0xd];
          data = conn->data;
          local_358 = pBVar21;
          iVar7 = do_file_type((char *)local_330);
          if (iVar7 != 0x2a && local_358 == (BIO *)0x0) goto LAB_0014a722;
          pcVar46 = (data->set).str[0xc];
          if (pcVar46 != (char *)0x0) {
            SSL_CTX_set_default_passwd_cb_userdata(pSVar18,pcVar46);
            SSL_CTX_set_default_passwd_cb(pSVar18,passwd_callback);
          }
          local_318 = (BIO *)CONCAT44(local_318._4_4_,uVar11);
          if (iVar7 < 0x2a) {
            if (iVar7 == 1) {
              iVar7 = SSL_CTX_use_certificate_chain_file(pSVar18,(char *)local_358);
              if (iVar7 == 1) {
LAB_00149ad4:
                bVar41 = 0;
LAB_0014a4fa:
                iVar7 = do_file_type((char *)local_328);
                if (iVar7 < 0x2a) {
                  if (iVar7 == 1) {
                    if (bVar41 == 0) {
                      if (local_340 == (BIO *)0x0) {
                        local_340 = local_358;
                      }
                      goto LAB_0014a558;
                    }
                  }
                  else {
                    if (iVar7 != 2) {
LAB_0014a534:
                      pcVar46 = "not supported file type for private key";
                      goto LAB_0014a703;
                    }
LAB_0014a558:
                    pBVar21 = local_340;
                    iVar7 = SSL_CTX_use_PrivateKey_file(pSVar18,(char *)local_340,iVar7);
                    if (iVar7 != 1) {
                      pEVar29 = (EVP_PKEY *)"PEM";
                      if (local_328 != (EVP_PKEY *)0x0) {
                        pEVar29 = local_328;
                      }
                      pcVar46 = "unable to set private key file: \'%s\' type %s";
                      goto LAB_0014a6e7;
                    }
                  }
LAB_0014a575:
                  pSVar38 = SSL_new(pSVar18);
                  if (pSVar38 == (SSL *)0x0) {
                    pcVar46 = "unable to create an SSL structure";
                  }
                  else {
                    pXVar22 = SSL_get_certificate(pSVar38);
                    local_238._0_1_ = (char)pXVar22;
                    local_238._1_7_ = (undefined7)((ulong)pXVar22 >> 8);
                    if (pXVar22 != (X509 *)0x0) {
                      pEVar29 = X509_get_pubkey(pXVar22);
                      from = SSL_get_privatekey(pSVar38);
                      EVP_PKEY_copy_parameters(pEVar29,from);
                      EVP_PKEY_free(pEVar29);
                    }
                    SSL_free(pSVar38);
                    iVar9 = SSL_CTX_check_private_key(pSVar18);
                    iVar7 = 0;
                    if (iVar9 != 0) goto LAB_0014a70f;
                    pcVar46 = "Private key does not match the certificate public key";
                  }
                }
                else if (iVar7 == 0x2a) {
                  if ((data->state).engine == (ENGINE *)0x0) {
                    pcVar46 = "crypto engine not set, can\'t load private key";
                  }
                  else {
                    method = UI_create_method("cURL user interface");
                    if (method == (UI_METHOD *)0x0) {
                      pcVar46 = "unable do create OpenSSL user-interface method";
                    }
                    else {
                      pUVar37 = UI_OpenSSL();
                      iVar7 = UI_method_get_opener((UI *)pUVar37);
                      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar7));
                      pUVar37 = UI_OpenSSL();
                      iVar7 = UI_method_get_closer((UI *)pUVar37);
                      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar7));
                      UI_method_set_reader(method,ssl_ui_reader);
                      UI_method_set_writer(method,ssl_ui_writer);
                      pEVar29 = ENGINE_load_private_key
                                          ((ENGINE *)(data->state).engine,(char *)local_340,method,
                                           (data->set).str[0xc]);
                      UI_destroy_method(method);
                      if (pEVar29 != (EVP_PKEY *)0x0) {
                        iVar7 = SSL_CTX_use_PrivateKey(pSVar18,pEVar29);
                        if (iVar7 != 1) {
                          Curl_failf(data,"unable to set private key");
                          EVP_PKEY_free(pEVar29);
                          goto LAB_0014a70a;
                        }
                        EVP_PKEY_free(pEVar29);
                        goto LAB_0014a575;
                      }
                      pcVar46 = "failed to load private key from crypto engine";
                    }
                  }
                }
                else {
                  if (iVar7 != 0x2b) goto LAB_0014a534;
                  if (bVar41 != 0) goto LAB_0014a575;
                  pcVar46 = "file type P12 for private key not supported";
                }
                goto LAB_0014a703;
              }
              uVar15 = ERR_get_error();
              pEVar29 = (EVP_PKEY *)ERR_error_string(uVar15,(char *)0x0);
              pcVar46 = 
              "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
            }
            else if (iVar7 == 2) {
              iVar7 = SSL_CTX_use_certificate_file(pSVar18,(char *)local_358,2);
              if (iVar7 == 1) goto LAB_00149ad4;
              uVar15 = ERR_get_error();
              pEVar29 = (EVP_PKEY *)ERR_error_string(uVar15,(char *)0x0);
              pcVar46 = 
              "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
            }
            else {
LAB_00149aa8:
              pcVar46 = "not supported file type \'%s\' for certificate";
              pEVar29 = local_330;
            }
            Curl_failf(data,pcVar46,pEVar29);
LAB_0014a70a:
            iVar7 = 1;
          }
          else {
            if (iVar7 == 0x2a) {
              e = (ENGINE *)(data->state).engine;
              if (e == (ENGINE *)0x0) {
                pcVar46 = "crypto engine not set, can\'t load certificate";
              }
              else {
                local_238._0_1_ = (char)local_358;
                local_238._1_7_ = (undefined7)((ulong)local_358 >> 8);
                uStack_230 = 0;
                uStack_22f = 0;
                iVar7 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
                if (iVar7 != 0) {
                  iVar7 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,
                                          &local_238,(f *)0x0,1);
                  if (iVar7 == 0) {
                    uVar15 = ERR_get_error();
                    pEVar29 = (EVP_PKEY *)ERR_error_string(uVar15,(char *)0x0);
                    pcVar46 = "ssl engine cannot load client cert with id \'%s\' [%s]";
                    pBVar21 = local_358;
LAB_0014a6e7:
                    Curl_failf(data,pcVar46,pBVar21,pEVar29);
                  }
                  else {
                    if ((X509 *)CONCAT71(uStack_22f,uStack_230) == (X509 *)0x0) {
                      pcVar46 = "ssl engine didn\'t initialized the certificate properly.";
                      goto LAB_0014a703;
                    }
                    iVar7 = SSL_CTX_use_certificate(pSVar18,(X509 *)CONCAT71(uStack_22f,uStack_230))
                    ;
                    if (iVar7 == 1) {
                      X509_free((X509 *)CONCAT71(uStack_22f,uStack_230));
                      bVar41 = 0;
                      goto LAB_0014a4fa;
                    }
                    Curl_failf(data,"unable to set client certificate");
                    X509_free((X509 *)CONCAT71(uStack_22f,uStack_230));
                  }
                  goto LAB_0014a70a;
                }
                pcVar46 = "ssl engine does not support loading certificates";
              }
LAB_0014a703:
              Curl_failf(data,pcVar46);
              goto LAB_0014a70a;
            }
            if (iVar7 != 0x2b) goto LAB_00149aa8;
            local_350 = (ASN1_GENERALIZEDTIME *)0x0;
            pFVar33 = fopen64((char *)local_358,"rb");
            if (pFVar33 == (FILE *)0x0) {
              pcVar46 = "could not open PKCS12 file \'%s\'";
LAB_0014a3ad:
              Curl_failf(data,pcVar46,local_358);
LAB_0014a3c1:
              bVar41 = 0;
              iVar7 = 1;
            }
            else {
              p12 = d2i_PKCS12_fp(pFVar33,(PKCS12 **)0x0);
              fclose(pFVar33);
              if (p12 == (PKCS12 *)0x0) {
                pcVar46 = "error reading PKCS12 file \'%s\'";
                goto LAB_0014a3ad;
              }
              PKCS12_PBE_add();
              iVar7 = PKCS12_parse(p12,(data->set).str[0xc],(EVP_PKEY **)local_2b8,&local_238,
                                   (stack_st_X509 **)&local_350);
              if (iVar7 == 0) {
                uVar15 = ERR_get_error();
                pcVar46 = ERR_error_string(uVar15,(char *)0x0);
                Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",
                           pcVar46);
                PKCS12_free(p12);
                goto LAB_0014a3c1;
              }
              PKCS12_free(p12);
              iVar7 = SSL_CTX_use_certificate
                                (pSVar18,(X509 *)CONCAT71(local_238._1_7_,(char)local_238));
              if (iVar7 == 1) {
                iVar7 = SSL_CTX_use_PrivateKey(pSVar18,(EVP_PKEY *)local_2b8[0]);
                if (iVar7 != 1) {
                  pcVar46 = "unable to use private key from PKCS12 file \'%s\'";
                  pBVar21 = local_358;
                  goto LAB_0014a4a8;
                }
                iVar7 = SSL_CTX_check_private_key(pSVar18);
                if (iVar7 == 0) {
                  pcVar46 = 
                  "private key from PKCS12 file \'%s\' does not match certificate in same file";
                  pBVar21 = local_358;
                  goto LAB_0014a4a8;
                }
                if (local_350 == (ASN1_GENERALIZEDTIME *)0x0) {
                  bVar50 = false;
                  goto LAB_0014a4b1;
                }
                do {
                  iVar7 = OPENSSL_sk_num(local_350);
                  bVar50 = iVar7 != 0;
                  if (iVar7 == 0) goto LAB_0014a4b1;
                  pXVar22 = (X509 *)OPENSSL_sk_pop(local_350);
                  lVar13 = SSL_CTX_ctrl(pSVar18,0xe,0,pXVar22);
                  if (lVar13 == 0) {
                    X509_free(pXVar22);
                    pcVar46 = "cannot add certificate to certificate chain";
LAB_001499c3:
                    Curl_failf(data,pcVar46);
                    iVar7 = 3;
                  }
                  else {
                    iVar9 = SSL_CTX_add_client_CA(pSVar18,pXVar22);
                    iVar7 = 0;
                    pcVar46 = "cannot add certificate to client CA list";
                    if (iVar9 == 0) goto LAB_001499c3;
                  }
                } while (iVar7 == 0);
                bVar50 = true;
                if (iVar7 == 3) goto LAB_0014a4b1;
                bVar41 = 0;
              }
              else {
                uVar15 = ERR_get_error();
                pBVar21 = (BIO *)ERR_error_string(uVar15,(char *)0x0);
                pcVar46 = "could not load PKCS12 client certificate, OpenSSL error %s";
LAB_0014a4a8:
                Curl_failf(data,pcVar46,pBVar21);
                bVar50 = true;
LAB_0014a4b1:
                EVP_PKEY_free((EVP_PKEY *)local_2b8[0]);
                X509_free((X509 *)CONCAT71(local_238._1_7_,(char)local_238));
                OPENSSL_sk_pop_free(local_350);
                iVar7 = 2 - (uint)bVar50;
                bVar41 = bVar50 ^ 1;
              }
            }
            if (iVar7 == 2) goto LAB_0014a4fa;
          }
LAB_0014a70f:
          CVar8 = CURLE_SSL_CERTPROBLEM;
          unaff_R12 = (connectdata *)((ulong)local_318 & 0xffffffff);
          if (iVar7 == 0) goto LAB_0014a722;
        }
      }
      else {
        Curl_failf(pCVar3,"Unsupported SSL protocol version");
LAB_001489d1:
        CVar8 = CURLE_SSL_CONNECT_ERROR;
      }
    }
LAB_00148773:
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  while (sVar1 = conn->ssl[lVar40].connecting_state, sVar1 - ssl_connect_2 < 3) {
    lVar13 = Curl_timeleft(pCVar2,(timeval *)0x0,true);
    if (lVar13 < 0) goto LAB_001486be;
    sVar1 = conn->ssl[lVar40].connecting_state;
    if ((sVar1 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar1 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_348;
      }
      readfd0 = -1;
      if (sVar1 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_348;
      }
      if (nonblocking) {
        lVar13 = 0;
      }
      iVar7 = Curl_socket_check(readfd0,-1,writefd,lVar13);
      if (iVar7 < 0) {
        puVar14 = (uint *)__errno_location();
        bVar50 = false;
        Curl_failf(pCVar2,"select/poll on SSL socket, errno: %d",(ulong)*puVar14);
        unaff_R12 = (connectdata *)0x23;
      }
      else {
        bVar50 = true;
        if (iVar7 == 0) {
          if (nonblocking) {
            *local_2e0 = false;
            bVar50 = false;
            unaff_R12 = (connectdata *)0x0;
          }
          else {
            bVar50 = false;
            Curl_failf(pCVar2,"SSL connection timeout");
            unaff_R12 = (connectdata *)0x1c;
          }
        }
      }
      if (!bVar50) {
        return (CURLcode)unaff_R12;
      }
    }
    pCVar3 = conn->data;
    ERR_clear_error();
    iVar7 = SSL_connect((SSL *)conn->ssl[lVar40].handle);
    if (iVar7 == 1) {
      conn->ssl[lVar40].connecting_state = ssl_connect_3;
      pSVar38 = (SSL *)conn->ssl[lVar40].handle;
      pcVar46 = "";
      if (pSVar38 != (SSL *)0x0) {
        iVar7 = SSL_version(pSVar38);
        pcVar46 = "TLSv1.2";
        switch(iVar7) {
        case 0x300:
          pcVar46 = "SSLv3";
          break;
        case 0x301:
          pcVar46 = "TLSv1.0";
          break;
        case 0x302:
          pcVar46 = "TLSv1.1";
          break;
        case 0x303:
          break;
        default:
          if (iVar7 == 2) {
            pcVar46 = "SSLv2";
          }
          else {
            pcVar46 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar40].handle);
      pcVar16 = SSL_CIPHER_get_name(c);
      CVar8 = CURLE_OK;
      Curl_infof(pCVar3,"SSL connection using %s / %s\n",pcVar46,pcVar16);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar40].handle,&local_238,local_2b8);
        if ((int)local_2b8[0] == 0) {
          Curl_infof(pCVar3,"ALPN, server did not agree to a protocol\n");
          CVar8 = CURLE_OK;
        }
        else {
          Curl_infof(pCVar3,"ALPN, server accepted to use %.*s\n",(ulong)local_2b8[0] & 0xffffffff,
                     CONCAT71(local_238._1_7_,(char)local_238));
          if (((int)local_2b8[0] == 8) &&
             (*(long *)CONCAT71(local_238._1_7_,(char)local_238) == 0x312e312f70747468)) {
            conn->negnpn = 2;
            CVar8 = CURLE_OK;
          }
        }
      }
    }
    else {
      iVar7 = SSL_get_error((SSL *)conn->ssl[lVar40].handle,iVar7);
      if (iVar7 == 3) {
        conn->ssl[lVar40].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar7 != 2) {
          memset(&local_238,0,0x100);
          conn->ssl[lVar40].connecting_state = ssl_connect_2;
          uVar15 = ERR_get_error();
          uVar11 = (uint)uVar15;
          if ((((int)uVar11 < 0) || ((uVar11 & 0xff800000) != 0xa000000)) ||
             ((uVar11 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar15,(char *)&local_238,0x100);
            CVar8 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar13 = SSL_get_verify_result((SSL *)conn->ssl[lVar40].handle);
            if (lVar13 == 0) {
              builtin_strncpy(local_228,"verification failed",0x14);
              local_238._0_1_ = 'S';
              local_238._1_7_ = 0x74726563204c53;
              uStack_230 = 0x69;
              uStack_22f = 0x20657461636966;
            }
            else {
              pcVar46 = X509_verify_cert_error_string(lVar13);
              curl_msnprintf((char *)&local_238,0x100,"SSL certificate problem: %s",pcVar46);
            }
            CVar8 = CURLE_SSL_CACERT;
          }
          if (uVar15 == 0) {
            Curl_failf(pCVar3,"Unknown SSL protocol error in connection to %s:%ld ",
                       (conn->host).name,(ulong)(uint)conn->remote_port);
          }
          else {
            Curl_failf(pCVar3,"%s",&local_238);
          }
          goto LAB_00148619;
        }
        conn->ssl[lVar40].connecting_state = ssl_connect_2_reading;
      }
      CVar8 = CURLE_OK;
    }
LAB_00148619:
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((nonblocking) && (conn->ssl[lVar40].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar1 != ssl_connect_3) goto LAB_0014a2ec;
  pCVar2 = conn->data;
  if ((conn->ssl_config).sessionid == true) {
    local_238._0_1_ = '\0';
    local_238._1_7_ = 0;
    pSVar17 = SSL_get1_session((SSL *)conn->ssl[lVar40].handle);
    Curl_ssl_sessionid_lock(conn);
    _Var5 = Curl_ssl_getsessionid(conn,&local_238,(size_t *)0x0);
    if ((_Var5) || ((SSL_SESSION *)CONCAT71(local_238._1_7_,(char)local_238) == pSVar17)) {
      if (_Var5) goto LAB_00148a0e;
      SSL_SESSION_free(pSVar17);
LAB_00148a51:
      Curl_ssl_sessionid_unlock(conn);
      bVar50 = true;
      pcVar45 = conn;
    }
    else {
      Curl_infof(pCVar2,"old SSL session ID is stale, removing\n");
      Curl_ssl_delsessionid(conn,(void *)CONCAT71(local_238._1_7_,(char)local_238));
LAB_00148a0e:
      CVar8 = Curl_ssl_addsessionid(conn,pSVar17,0);
      if (CVar8 == CURLE_OK) goto LAB_00148a51;
      Curl_ssl_sessionid_unlock(conn);
      bVar50 = false;
      Curl_failf(pCVar2,"failed to store ssl session");
      pcVar45 = (connectdata *)(ulong)CVar8;
    }
    CVar8 = (CURLcode)pcVar45;
    if (bVar50) goto LAB_00148a68;
  }
  else {
LAB_00148a68:
    uVar6 = 1;
    if ((pCVar2->set).ssl.verifypeer == false) {
      uVar6 = (pCVar2->set).ssl.verifyhost;
    }
    local_340 = (BIO *)CONCAT71(local_340._1_7_,uVar6);
    pCVar2 = conn->data;
    pBVar19 = BIO_s_mem();
    local_318 = BIO_new(pBVar19);
    if ((pCVar2->set).ssl.certinfo == true) {
      pCVar3 = conn->data;
      psVar20 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar40].handle);
      if (psVar20 != (stack_st_X509 *)0x0) {
        iVar7 = OPENSSL_sk_num(psVar20);
        CVar8 = Curl_ssl_init_certinfo(pCVar3,iVar7);
        if (CVar8 == CURLE_OK) {
          pBVar19 = BIO_s_mem();
          pBVar21 = BIO_new(pBVar19);
          local_328 = (EVP_PKEY *)CONCAT44(local_328._4_4_,iVar7);
          if (0 < iVar7) {
            iVar7 = 0;
            local_358 = pBVar21;
            local_2f0 = psVar49;
            do {
              pXVar22 = (X509 *)OPENSSL_sk_value(psVar20,iVar7);
              local_308 = (int *)0x0;
              pXVar23 = X509_get_subject_name(pXVar22);
              X509_NAME_print_ex(pBVar21,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Subject",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pXVar23 = X509_get_issuer_name(pXVar22);
              X509_NAME_print_ex(pBVar21,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Issuer",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              uVar25 = X509_get_version(pXVar22);
              BIO_printf(pBVar21,"%lx",uVar25);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Version",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              local_348 = pXVar22;
              pAVar26 = X509_get_serialNumber(pXVar22);
              if (pAVar26->type == 0x102) {
                BIO_puts(pBVar21,"-");
              }
              if (0 < pAVar26->length) {
                lVar40 = 0;
                do {
                  BIO_printf(pBVar21,"%02x",(ulong)pAVar26->data[lVar40]);
                  lVar40 = lVar40 + 1;
                } while (lVar40 < pAVar26->length);
              }
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Serial Number",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              local_338 = (X509_ALGOR *)0x0;
              pAVar27 = ASN1_STRING_new();
              if (pAVar27 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_308,&local_338,local_348);
                X509_signature_print(pBVar21,local_338,pAVar27);
                ASN1_STRING_free(pAVar27);
                if (local_338 != (X509_ALGOR *)0x0) {
                  i2a_ASN1_OBJECT(pBVar21,local_338->algorithm);
                  sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
                  Curl_ssl_push_certinfo_len
                            (pCVar3,iVar7,"Public Key Algorithm",(char *)local_360,sVar24);
                  BIO_ctrl(pBVar21,1,0,(void *)0x0);
                }
              }
              uVar25 = X509_get0_extensions(local_348);
              iVar9 = OPENSSL_sk_num(uVar25);
              if ((0 < iVar9) && (iVar9 = OPENSSL_sk_num(uVar25), 0 < iVar9)) {
                iVar9 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar25,iVar9);
                  pBVar19 = BIO_s_mem();
                  pBVar21 = BIO_new(pBVar19);
                  if (pBVar21 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_2b8,0x80,a);
                  iVar10 = X509V3_EXT_print(pBVar21,ex,0,0);
                  if (iVar10 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar21,v);
                  }
                  BIO_ctrl(pBVar21,0x73,0,&local_350);
                  uVar15._0_4_ = local_350->length;
                  uVar15._4_4_ = local_350->type;
                  if (uVar15 != 0) {
                    pcVar46 = (char *)&local_238;
                    uVar47 = 0;
                    do {
                      puVar35 = local_350->data;
                      pcVar16 = "";
                      if (puVar35[uVar47] == '\n') {
                        pcVar16 = ", ";
                      }
                      uVar47 = (puVar35[uVar47] == '\n') + uVar47;
                      if (uVar47 < uVar15) {
                        uVar43 = puVar35[uVar47];
                        uVar48 = uVar47;
                        while (uVar43 == ' ') {
                          uVar47 = uVar15;
                          if (uVar15 <= uVar48 + 1) goto LAB_00148ec0;
                          uVar43 = puVar35[uVar48 + 1];
                          uVar48 = uVar48 + 1;
                        }
                        iVar10 = curl_msnprintf(pcVar46,(size_t)(local_38 + -(long)pcVar46),"%s%c",
                                                pcVar16,(ulong)(uint)(int)(char)uVar43);
                        pcVar46 = pcVar46 + iVar10;
                        uVar47 = uVar48;
                      }
LAB_00148ec0:
                      uVar47 = uVar47 + 1;
                      uVar15._0_4_ = local_350->length;
                      uVar15._4_4_ = local_350->type;
                    } while (uVar47 < uVar15);
                  }
                  Curl_ssl_push_certinfo(pCVar3,iVar7,(char *)local_2b8,(char *)&local_238);
                  BIO_free(pBVar21);
                  iVar9 = iVar9 + 1;
                  iVar10 = OPENSSL_sk_num(uVar25);
                } while (iVar9 < iVar10);
              }
              pXVar22 = local_348;
              pAVar28 = (ASN1_TIME *)X509_getm_notBefore(local_348);
              pBVar21 = local_358;
              ASN1_TIME_print(local_358,pAVar28);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Start date",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pAVar28 = (ASN1_TIME *)X509_getm_notAfter(pXVar22);
              ASN1_TIME_print(pBVar21,pAVar28);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Expire date",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pEVar29 = X509_get_pubkey(pXVar22);
              if (pEVar29 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar3,"   Unable to load public key\n");
                psVar49 = local_2f0;
              }
              else {
                iVar9 = EVP_PKEY_get_id(pEVar29);
                psVar49 = local_2f0;
                if (iVar9 == 0x74) {
                  uVar25 = EVP_PKEY_get0_DSA(pEVar29);
                  local_330 = pEVar29;
                  DSA_get0_pqg(uVar25,&local_238,local_2b8,&local_350);
                  DSA_get0_key(uVar25,&local_310,&local_338);
                  pBVar44 = (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238);
                  pcVar46 = "dsa";
LAB_001492a4:
                  pBVar21 = local_358;
                  pubkey_show(pCVar3,(BIO *)local_358,iVar7,pcVar46,"p",pBVar44);
                  pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,pcVar46,"q",(BIGNUM *)local_2b8[0]);
                  pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,pcVar46,"g",(BIGNUM *)local_350);
                  pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,pcVar46,"priv_key",(BIGNUM *)local_338);
                  pcVar16 = "pub_key";
                  pBVar44 = local_310;
LAB_0014932a:
                  pEVar29 = local_330;
                  pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,pcVar46,pcVar16,pBVar44);
                }
                else {
                  if (iVar9 == 0x1c) {
                    uVar25 = EVP_PKEY_get0_DH(pEVar29);
                    local_330 = pEVar29;
                    DH_get0_pqg(uVar25,&local_238,local_2b8,&local_350);
                    DH_get0_key(uVar25,&local_310,&local_338);
                    pBVar44 = (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238);
                    pcVar46 = "dh";
                    goto LAB_001492a4;
                  }
                  if (iVar9 == 6) {
                    uVar25 = EVP_PKEY_get0_RSA(pEVar29);
                    local_330 = pEVar29;
                    RSA_get0_key(uVar25,&local_238,local_2b8,&local_350);
                    RSA_get0_factors(uVar25,&local_338,&local_310);
                    RSA_get0_crt_params(uVar25,&local_2c0,&local_2c8,&local_2d0);
                    pBVar21 = local_358;
                    BN_print(local_358,(BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                    sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
                    Curl_ssl_push_certinfo_len
                              (pCVar3,iVar7,"RSA Public Key",(char *)local_360,sVar24);
                    BIO_ctrl(pBVar21,1,0,(void *)0x0);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","n",
                                (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","e",(BIGNUM *)local_2b8[0]);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","d",(BIGNUM *)local_350);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","p",(BIGNUM *)local_338);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","q",local_310);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","dmp1",local_2c0);
                    pubkey_show(pCVar3,(BIO *)pBVar21,iVar7,"rsa","dmq1",local_2c8);
                    pcVar46 = "rsa";
                    pcVar16 = "iqmp";
                    pBVar44 = local_2d0;
                    goto LAB_0014932a;
                  }
                }
                EVP_PKEY_free(pEVar29);
              }
              pBVar21 = local_358;
              if (local_308 != (int *)0x0) {
                if (0 < *local_308) {
                  lVar40 = 0;
                  do {
                    BIO_printf(pBVar21,"%02x:",(ulong)*(byte *)(*(long *)(local_308 + 2) + lVar40));
                    lVar40 = lVar40 + 1;
                  } while (lVar40 < *local_308);
                }
                sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
                Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Signature",(char *)local_360,sVar24);
                BIO_ctrl(pBVar21,1,0,(void *)0x0);
              }
              pBVar21 = local_358;
              PEM_write_bio_X509(local_358,local_348);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_360);
              Curl_ssl_push_certinfo_len(pCVar3,iVar7,"Cert",(char *)local_360,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              iVar7 = iVar7 + 1;
            } while (iVar7 != (int)local_328);
          }
          BIO_free(pBVar21);
        }
      }
    }
    pXVar30 = (X509 *)SSL_get1_peer_certificate(psVar49->handle);
    psVar49->server_cert = pXVar30;
    if (pXVar30 == (X509 *)0x0) {
      CVar8 = CURLE_OK;
      if ((char)local_340 != '\0') {
        Curl_failf(pCVar2,"SSL: couldn\'t get peer certificate!");
        CVar8 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      pcVar46 = (pCVar2->state).buffer;
      Curl_infof(pCVar2,"Server certificate:\n");
      pXVar23 = X509_get_subject_name((X509 *)psVar49->server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar23,pcVar46,size);
      pcVar16 = "[NONE]";
      if (iVar7 == 0) {
        pcVar16 = pcVar46;
      }
      local_2d8 = pcVar46;
      Curl_infof(pCVar2," subject: %s\n",pcVar16);
      pAVar28 = (ASN1_TIME *)X509_getm_notBefore(psVar49->server_cert);
      pBVar21 = local_318;
      ASN1_TIME_print(local_318,pAVar28);
      lVar40 = BIO_ctrl(pBVar21,3,0,&local_308);
      Curl_infof(pCVar2," start date: %.*s\n",lVar40);
      BIO_ctrl(pBVar21,1,0,(void *)0x0);
      pAVar28 = (ASN1_TIME *)X509_getm_notAfter(psVar49->server_cert);
      ASN1_TIME_print(pBVar21,pAVar28);
      lVar40 = BIO_ctrl(pBVar21,3,0,&local_308);
      Curl_infof(pCVar2," expire date: %.*s\n",lVar40);
      BIO_ctrl(pBVar21,1,0,(void *)0x0);
      BIO_free(pBVar21);
      if ((pCVar2->set).ssl.verifyhost == true) {
        local_2f8 = (X509 *)psVar49->server_cert;
        local_320 = conn->data;
        if (((conn->bits).ipv6_ip == true) &&
           (iVar7 = inet_pton(10,(conn->host).name,&local_238), iVar7 != 0)) {
          local_348 = (X509 *)CONCAT44(local_348._4_4_,7);
          local_318 = (BIO *)0x10;
        }
        else {
          iVar7 = inet_pton(2,(conn->host).name,&local_238);
          local_318 = (BIO *)(ulong)((uint)(iVar7 != 0) * 4);
          local_348 = (X509 *)CONCAT44(local_348._4_4_,(uint)(iVar7 != 0) * 5 + 2);
        }
        CVar8 = CURLE_OK;
        pEVar29 = (EVP_PKEY *)0x0;
        a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(local_2f8,0x55,(int *)0x0,(int *)0x0);
        if (a_00 == (GENERAL_NAMES *)0x0) {
          pEVar29 = (EVP_PKEY *)0x0;
          bVar41 = 0;
        }
        else {
          iVar7 = OPENSSL_sk_num(a_00);
          local_358 = (BIO *)CONCAT44(local_358._4_4_,iVar7);
          if (iVar7 < 1) {
            local_328 = (EVP_PKEY *)0x0;
            bVar41 = 0;
          }
          else {
            iVar7 = 1;
            local_328 = (EVP_PKEY *)0x0;
            local_330 = (EVP_PKEY *)0x0;
            local_300 = 0;
            bVar41 = 0;
            do {
              piVar31 = (int *)OPENSSL_sk_value(a_00,iVar7 + -1);
              iVar9 = *piVar31;
              uVar39 = (undefined7)((ulong)pEVar29 >> 8);
              if (iVar9 == 2) {
                pEVar29 = (EVP_PKEY *)CONCAT71(uVar39,1);
                local_328 = pEVar29;
              }
              else if (iVar9 == 7) {
                pEVar29 = (EVP_PKEY *)CONCAT71(uVar39,1);
                local_330 = pEVar29;
              }
              iVar10 = (curl_socket_t)local_348;
              if (iVar9 == (curl_socket_t)local_348) {
                __s = (EVP_PKEY *)ASN1_STRING_data(*(ASN1_STRING **)(piVar31 + 2));
                iVar9 = ASN1_STRING_length(*(ASN1_STRING **)(piVar31 + 2));
                pBVar21 = (BIO *)(long)iVar9;
                if (iVar10 == 7) {
                  if ((local_318 == pBVar21) &&
                     (iVar9 = bcmp(__s,&local_238,(size_t)pBVar21), iVar9 == 0)) {
                    Curl_infof(local_320,
                               " subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                               (conn->host).dispname);
                    local_300 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                }
                else if (((iVar10 == 2) &&
                         (pBVar32 = (BIO *)strlen((char *)__s), pBVar32 == pBVar21)) &&
                        (iVar9 = Curl_cert_hostcheck((char *)__s,(conn->host).name), iVar9 != 0)) {
                  Curl_infof(local_320," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             (conn->host).dispname);
                  bVar41 = 1;
                  pEVar29 = __s;
                }
              }
            } while ((iVar7 < (int)local_358) && (iVar7 = iVar7 + 1, bVar41 == 0));
            local_328 = (EVP_PKEY *)
                        CONCAT71((int7)((ulong)local_328 >> 8),(byte)local_328 | (byte)local_330);
            bVar41 = bVar41 | (byte)local_300;
          }
          GENERAL_NAMES_free(a_00);
          pEVar29 = local_328;
        }
        pCVar3 = local_320;
        if ((bVar41 & 1) == 0) {
          if (((ulong)pEVar29 & 1) == 0) {
            local_2b8[0] = (SSL_SESSION *)0x154c50;
            pXVar23 = X509_get_subject_name(local_2f8);
            if (pXVar23 == (X509_NAME *)0x0) {
              iVar7 = -1;
            }
            else {
              iVar9 = -1;
              do {
                iVar7 = iVar9;
                iVar9 = X509_NAME_get_index_by_NID(pXVar23,0xd,iVar7);
              } while (-1 < iVar9);
            }
            CVar42 = CURLE_OK;
            bVar50 = true;
            CVar8 = CURLE_OK;
            if (-1 < iVar7) {
              ne = X509_NAME_get_entry(pXVar23,iVar7);
              pAVar27 = X509_NAME_ENTRY_get_data(ne);
              CVar8 = CVar42;
              if (pAVar27 != (ASN1_STRING *)0x0) {
                iVar7 = ASN1_STRING_type(pAVar27);
                if (iVar7 == 0xc) {
                  uVar11 = ASN1_STRING_length(pAVar27);
                  if ((-1 < (int)uVar11) &&
                     (pSVar17 = (SSL_SESSION *)
                                CRYPTO_malloc(uVar11 + 1,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                              ,0x4bd), local_2b8[0] = pSVar17,
                     pSVar17 != (SSL_SESSION *)0x0)) {
                    puVar35 = ASN1_STRING_data(pAVar27);
                    memcpy(pSVar17,puVar35,(ulong)uVar11);
                    *(undefined1 *)((long)local_2b8[0]->key_arg + ((ulong)uVar11 - 8)) = 0;
                  }
                }
                else {
                  uVar11 = ASN1_STRING_to_UTF8((uchar **)local_2b8,pAVar27);
                }
                if (local_2b8[0] != (SSL_SESSION *)0x0) {
                  uznum = strlen((char *)local_2b8[0]);
                  uVar12 = curlx_uztosi(uznum);
                  if (uVar12 != uVar11) {
                    bVar50 = false;
                    Curl_failf(local_320,"SSL: illegal cert name field");
                    CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
              }
            }
            if (local_2b8[0] == (SSL_SESSION *)0x154c50) {
              local_2b8[0] = (SSL_SESSION *)0x0;
            }
            if (bVar50) {
              if (local_2b8[0] == (SSL_SESSION *)0x0) {
                Curl_failf(local_320,"SSL: unable to obtain common name from peer certificate");
              }
              else {
                iVar7 = Curl_cert_hostcheck((char *)local_2b8[0],(conn->host).name);
                if (iVar7 != 0) {
                  CVar8 = CURLE_OK;
                  Curl_infof(local_320," common name: %s (matched)\n");
                  goto LAB_00149cbe;
                }
                Curl_failf(local_320,
                           "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                           ,local_2b8[0]);
              }
              CVar8 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_00149cbe:
            if (local_2b8[0] != (SSL_SESSION *)0x0) {
              CRYPTO_free(local_2b8[0]);
            }
          }
          else {
            Curl_infof(local_320," subjectAltName does not match %s\n",(conn->host).dispname);
            Curl_failf(pCVar3,
                       "SSL: no alternative certificate subject name matches target host name \'%s\'"
                       ,(conn->host).dispname);
            CVar8 = CURLE_PEER_FAILED_VERIFICATION;
          }
        }
        if (CVar8 == CURLE_OK) goto LAB_00149ce5;
LAB_00149fa3:
        X509_free((X509 *)psVar49->server_cert);
        psVar49->server_cert = (X509 *)0x0;
      }
      else {
LAB_00149ce5:
        pXVar23 = X509_get_issuer_name((X509 *)psVar49->server_cert);
        pcVar46 = local_2d8;
        iVar7 = x509_name_oneline((X509_NAME *)pXVar23,local_2d8,size_00);
        if (iVar7 == 0) {
          Curl_infof(pCVar2," issuer: %s\n",pcVar46);
          pcVar46 = (pCVar2->set).str[0x1c];
          if (pcVar46 != (char *)0x0) {
            pFVar33 = fopen64(pcVar46,"r");
            if (pFVar33 == (FILE *)0x0) {
              if ((char)local_340 != '\0') {
                Curl_failf(pCVar2,"SSL: Unable to open issuer cert (%s)",(pCVar2->set).str[0x1c]);
              }
              pXVar22 = (X509 *)psVar49->server_cert;
            }
            else {
              pXVar22 = PEM_read_X509(pFVar33,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
              if (pXVar22 == (X509 *)0x0) {
                if ((char)local_340 != '\0') {
                  Curl_failf(pCVar2,"SSL: Unable to read issuer cert (%s)",(pCVar2->set).str[0x1c]);
                }
                X509_free((X509 *)psVar49->server_cert);
                X509_free((X509 *)0x0);
                fclose(pFVar33);
                CVar8 = CURLE_SSL_ISSUER_ERROR;
                goto LAB_0014a2da;
              }
              fclose(pFVar33);
              iVar7 = X509_check_issued(pXVar22,(X509 *)psVar49->server_cert);
              if (iVar7 == 0) {
                Curl_infof(pCVar2," SSL certificate issuer check ok (%s)\n",(pCVar2->set).str[0x1c])
                ;
                X509_free(pXVar22);
                goto LAB_00149e7c;
              }
              if ((char)local_340 != '\0') {
                Curl_failf(pCVar2,"SSL: Certificate issuer check failed (%s)",
                           (pCVar2->set).str[0x1c]);
              }
              X509_free((X509 *)psVar49->server_cert);
            }
            X509_free(pXVar22);
            psVar49->server_cert = (X509 *)0x0;
            CVar8 = CURLE_SSL_ISSUER_ERROR;
            goto LAB_0014a2da;
          }
LAB_00149e7c:
          lVar40 = SSL_get_verify_result((SSL *)psVar49->handle);
          (pCVar2->set).ssl.certverifyresult = lVar40;
          if (lVar40 == 0) {
            CVar42 = CURLE_OK;
            Curl_infof(pCVar2," SSL certificate verify ok.\n");
          }
          else if ((pCVar2->set).ssl.verifypeer == true) {
            CVar42 = CURLE_PEER_FAILED_VERIFICATION;
            if ((char)local_340 != '\0') {
              pcVar46 = X509_verify_cert_error_string(lVar40);
              Curl_failf(pCVar2,"SSL certificate verify result: %s (%ld)",pcVar46,lVar40);
            }
          }
          else {
            pcVar46 = X509_verify_cert_error_string(lVar40);
            CVar42 = CURLE_OK;
            Curl_infof(pCVar2," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                       pcVar46,lVar40);
          }
        }
        else {
          CVar42 = CURLE_SSL_CONNECT_ERROR;
          if ((char)local_340 != '\0') {
            Curl_failf(pCVar2,"SSL: couldn\'t get X509-issuer name!");
          }
        }
        if ((pCVar2->set).ssl.verifystatus == true) {
          pCVar3 = conn->data;
          lVar40 = SSL_ctrl((SSL *)psVar49->handle,0x46,0,&local_238);
          if (CONCAT71(local_238._1_7_,(char)local_238) == 0) {
            pcVar46 = "No OCSP response received";
LAB_00149f74:
            pXVar22 = (X509 *)0x0;
            Curl_failf(pCVar3,pcVar46);
            CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
            bs = (OCSP_BASICRESP *)0x0;
          }
          else {
            pXVar22 = (X509 *)d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_238,lVar40);
            if (pXVar22 == (X509 *)0x0) {
              pcVar46 = "Invalid OCSP response";
              goto LAB_00149f74;
            }
            uVar11 = OCSP_response_status((OCSP_RESPONSE *)pXVar22);
            if (uVar11 == 0) {
              bs = OCSP_response_get1_basic((OCSP_RESPONSE *)pXVar22);
              if (bs == (OCSP_BASICRESP *)0x0) {
                Curl_failf(pCVar3,"Invalid OCSP response");
                goto LAB_00149f5c;
              }
              psVar20 = SSL_get_peer_cert_chain((SSL *)psVar49->handle);
              pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)psVar49->ctx);
              CVar8 = CURLE_OK;
              iVar7 = OCSP_basic_verify(bs,psVar20,pXVar36,0);
              if (iVar7 < 1) {
                Curl_failf(pCVar3,"OCSP response verification failed");
                CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                iVar7 = OCSP_resp_count(bs);
                if (0 < iVar7) {
                  iVar7 = 0;
                  CVar8 = CURLE_OK;
                  local_348 = pXVar22;
                  do {
                    single = OCSP_resp_get0(bs,iVar7);
                    if (single == (OCSP_SINGLERESP *)0x0) {
                      uVar11 = 5;
                    }
                    else {
                      uVar11 = OCSP_single_get0_status
                                         (single,(int *)&local_338,
                                          (ASN1_GENERALIZEDTIME **)local_2b8,&local_350,&local_360);
                      iVar9 = OCSP_check_validity(local_350,local_360,300,-1);
                      if (iVar9 == 0) {
                        Curl_failf(pCVar3,"OCSP response has expired");
                        uVar11 = 2;
                        CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                      else {
                        pcVar46 = OCSP_cert_status_str((long)(int)uVar11);
                        Curl_infof(pCVar3,"SSL certificate status: %s (%d)\n",pcVar46,(ulong)uVar11)
                        ;
                        if (uVar11 != 2) {
                          if (uVar11 != 1) {
                            uVar11 = 0;
                            pXVar22 = local_348;
                            goto LAB_0014a231;
                          }
                          pcVar46 = OCSP_crl_reason_str((long)(int)local_338);
                          Curl_failf(pCVar3,"SSL certificate revocation reason: %s (%d)",pcVar46,
                                     (ulong)local_338 & 0xffffffff);
                          uVar11 = 2;
                        }
                        CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
                        pXVar22 = local_348;
                      }
                    }
LAB_0014a231:
                    if ((uVar11 != 0) && (uVar11 != 5)) {
                      if (uVar11 != 2) goto LAB_00149f9e;
                      break;
                    }
                    iVar7 = iVar7 + 1;
                    iVar9 = OCSP_resp_count(bs);
                  } while (iVar7 < iVar9);
                }
              }
            }
            else {
              pcVar46 = OCSP_response_status_str((long)(int)uVar11);
              Curl_failf(pCVar3,"Invalid OCSP response status: %s (%d)",pcVar46,(ulong)uVar11);
LAB_00149f5c:
              bs = (OCSP_BASICRESP *)0x0;
              CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
            }
          }
          if (bs != (OCSP_BASICRESP *)0x0) {
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free((OCSP_RESPONSE *)pXVar22);
LAB_00149f9e:
          if (CVar8 != CURLE_OK) goto LAB_00149fa3;
          CVar42 = CURLE_OK;
        }
        CVar8 = CURLE_OK;
        if ((char)local_340 != '\0') {
          CVar8 = CVar42;
        }
        piVar31 = (int *)(pCVar2->set).str[0x16];
        local_308 = piVar31;
        if (piVar31 != (int *)0x0 && CVar8 == CURLE_OK) {
          pXVar30 = psVar49->server_cert;
          local_238._0_1_ = '\0';
          local_238._1_7_ = 0;
          if (pXVar30 == (X509 *)0x0) {
            CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
            puVar35 = (uchar *)0x0;
            uVar11 = i2d_X509_PUBKEY(pXVar34,(uchar **)0x0);
            CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            if (0 < (int)uVar11) {
              puVar35 = (uchar *)CRYPTO_malloc(uVar11,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                               ,0xa45);
              local_238._0_1_ = (char)puVar35;
              local_238._1_7_ = (undefined7)((ulong)puVar35 >> 8);
              if (puVar35 == (uchar *)0x0) {
                puVar35 = (uchar *)0x0;
              }
              else {
                pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
                uVar12 = i2d_X509_PUBKEY(pXVar34,(uchar **)&local_238);
                if ((CONCAT71(local_238._1_7_,(char)local_238) != 0 && uVar11 == uVar12) &&
                    CONCAT71(local_238._1_7_,(char)local_238) - (long)puVar35 == (ulong)uVar11) {
                  CVar8 = Curl_pin_peer_pubkey(pCVar2,(char *)piVar31,puVar35,(ulong)uVar11);
                }
              }
            }
            if (puVar35 != (uchar *)0x0) {
              CRYPTO_free(puVar35);
            }
          }
          if (CVar8 == CURLE_OK) {
            CVar8 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar2,"SSL: public key does not match pinned public key!");
          }
        }
        X509_free((X509 *)psVar49->server_cert);
        psVar49->server_cert = (X509 *)0x0;
        psVar49->connecting_state = ssl_connect_done;
      }
    }
LAB_0014a2da:
    if (CVar8 == CURLE_OK) {
      psVar49->connecting_state = ssl_connect_done;
    }
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0014a2ec:
  bVar50 = psVar49->connecting_state == ssl_connect_done;
  if (bVar50) {
    psVar49->state = ssl_connection_complete;
    conn->recv[local_2e8] = ossl_recv;
    conn->send[local_2e8] = ossl_send;
  }
  *local_2e0 = bVar50;
  psVar49->connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  long timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_ready(readfd, writefd, nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      else if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        else {
          /* timeout */
          failf(data, "SSL connection timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}